

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitfoot.cpp
# Opt level: O1

bool __thiscall
bitfoot::Bitfoot::SetEngineOption(Bitfoot *this,string *optionName,string *optionValue)

{
  char *pcVar1;
  long *plVar2;
  string *psVar3;
  bool bVar4;
  int iVar5;
  undefined4 uVar6;
  int64_t iVar7;
  undefined4 *puVar8;
  undefined1 *puVar9;
  long *local_58;
  size_t local_50;
  long local_48 [2];
  string *local_38;
  
  pcVar1 = (optionName->_M_dataplus)._M_p;
  local_58 = local_48;
  local_38 = optionName;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,_optHash._16_8_,_optHash._24_8_ + _optHash._16_8_);
  plVar2 = local_58;
  iVar5 = strcasecmp(pcVar1,(char *)local_58);
  if (plVar2 != local_48) {
    operator_delete(plVar2,local_48[0] + 1);
  }
  if ((iVar5 == 0) &&
     (bVar4 = senjo::EngineOption::SetValue((EngineOption *)_optHash,optionValue), bVar4)) {
    iVar7 = senjo::EngineOption::GetIntValue((EngineOption *)_optHash);
    SetHashSize(this,iVar7);
    return true;
  }
  pcVar1 = (local_38->_M_dataplus)._M_p;
  local_58 = local_48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,_optClearHash._16_8_,_optClearHash._24_8_ + _optClearHash._16_8_);
  plVar2 = local_58;
  iVar5 = strcasecmp(pcVar1,(char *)local_58);
  if (plVar2 != local_48) {
    operator_delete(plVar2,local_48[0] + 1);
  }
  psVar3 = local_38;
  if (iVar5 == 0) {
    TranspositionTable::_stores = 0;
    TranspositionTable::_hits = 0;
    TranspositionTable::_checkmates = 0;
    TranspositionTable::_stalemates = 0;
    if (DAT_001adcb8 != (void *)0x0) {
      memset(DAT_001adcb8,0,_tt * 0x10 + 0x10);
      return true;
    }
    TranspositionTable::_stores = 0;
    TranspositionTable::_hits = 0;
    TranspositionTable::_checkmates = 0;
    TranspositionTable::_stalemates = 0;
    return true;
  }
  pcVar1 = (local_38->_M_dataplus)._M_p;
  local_58 = local_48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,_optContempt._16_8_,_optContempt._24_8_ + _optContempt._16_8_);
  plVar2 = local_58;
  iVar5 = strcasecmp(pcVar1,(char *)local_58);
  if (plVar2 != local_48) {
    operator_delete(plVar2,local_48[0] + 1);
  }
  if ((iVar5 == 0) &&
     (bVar4 = senjo::EngineOption::SetValue((EngineOption *)_optContempt,optionValue), bVar4)) {
    iVar7 = senjo::EngineOption::GetIntValue((EngineOption *)_optContempt);
    uVar6 = (undefined4)iVar7;
    puVar8 = &_contempt;
  }
  else {
    pcVar1 = (psVar3->_M_dataplus)._M_p;
    local_58 = local_48;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_58,_optDelta._16_8_,_optDelta._24_8_ + _optDelta._16_8_);
    plVar2 = local_58;
    iVar5 = strcasecmp(pcVar1,(char *)local_58);
    if (plVar2 != local_48) {
      operator_delete(plVar2,local_48[0] + 1);
    }
    if ((iVar5 != 0) ||
       (bVar4 = senjo::EngineOption::SetValue((EngineOption *)_optDelta,optionValue), !bVar4)) {
      pcVar1 = (psVar3->_M_dataplus)._M_p;
      local_58 = local_48;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_58,_optEXT._16_8_,_optEXT._24_8_ + _optEXT._16_8_);
      plVar2 = local_58;
      iVar5 = strcasecmp(pcVar1,(char *)local_58);
      if (plVar2 != local_48) {
        operator_delete(plVar2,local_48[0] + 1);
      }
      if ((iVar5 == 0) &&
         (bVar4 = senjo::EngineOption::SetValue((EngineOption *)_optEXT,optionValue), bVar4)) {
        local_58 = local_48;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_58,_optEXT._48_8_,_optEXT._56_8_ + _optEXT._48_8_);
        if (local_50 == DAT_001532b0) {
          if (local_50 == 0) {
            bVar4 = true;
          }
          else {
            iVar5 = bcmp(local_58,_TRUE_abi_cxx11_,local_50);
            bVar4 = iVar5 == 0;
          }
        }
        else {
          bVar4 = false;
        }
        puVar9 = &_ext;
      }
      else {
        pcVar1 = (psVar3->_M_dataplus)._M_p;
        local_58 = local_48;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_58,_optFutility._16_8_,_optFutility._24_8_ + _optFutility._16_8_
                  );
        plVar2 = local_58;
        iVar5 = strcasecmp(pcVar1,(char *)local_58);
        if (plVar2 != local_48) {
          operator_delete(plVar2,local_48[0] + 1);
        }
        if ((iVar5 == 0) &&
           (bVar4 = senjo::EngineOption::SetValue((EngineOption *)_optFutility,optionValue), bVar4))
        {
          iVar7 = senjo::EngineOption::GetIntValue((EngineOption *)_optFutility);
          uVar6 = (undefined4)iVar7;
          puVar8 = &_futility;
          goto LAB_00106a42;
        }
        pcVar1 = (psVar3->_M_dataplus)._M_p;
        local_58 = local_48;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_58,_optIID._16_8_,_optIID._24_8_ + _optIID._16_8_);
        plVar2 = local_58;
        iVar5 = strcasecmp(pcVar1,(char *)local_58);
        if (plVar2 != local_48) {
          operator_delete(plVar2,local_48[0] + 1);
        }
        if ((iVar5 == 0) &&
           (bVar4 = senjo::EngineOption::SetValue((EngineOption *)_optIID,optionValue), bVar4)) {
          local_58 = local_48;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_58,_optIID._48_8_,_optIID._56_8_ + _optIID._48_8_);
          if (local_50 == DAT_001532b0) {
            if (local_50 == 0) {
              bVar4 = true;
            }
            else {
              iVar5 = bcmp(local_58,_TRUE_abi_cxx11_,local_50);
              bVar4 = iVar5 == 0;
            }
          }
          else {
            bVar4 = false;
          }
          puVar9 = &_iid;
        }
        else {
          pcVar1 = (psVar3->_M_dataplus)._M_p;
          local_58 = local_48;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_58,_optLMR._16_8_,_optLMR._24_8_ + _optLMR._16_8_);
          plVar2 = local_58;
          iVar5 = strcasecmp(pcVar1,(char *)local_58);
          if (plVar2 != local_48) {
            operator_delete(plVar2,local_48[0] + 1);
          }
          if ((iVar5 == 0) &&
             (bVar4 = senjo::EngineOption::SetValue((EngineOption *)_optLMR,optionValue), bVar4)) {
            local_58 = local_48;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_58,_optLMR._48_8_,_optLMR._56_8_ + _optLMR._48_8_);
            if (local_50 == DAT_001532b0) {
              if (local_50 == 0) {
                bVar4 = true;
              }
              else {
                iVar5 = bcmp(local_58,_TRUE_abi_cxx11_,local_50);
                bVar4 = iVar5 == 0;
              }
            }
            else {
              bVar4 = false;
            }
            puVar9 = &_lmr;
          }
          else {
            pcVar1 = (psVar3->_M_dataplus)._M_p;
            local_58 = local_48;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_58,_optNMP._16_8_,_optNMP._24_8_ + _optNMP._16_8_);
            plVar2 = local_58;
            iVar5 = strcasecmp(pcVar1,(char *)local_58);
            if (plVar2 != local_48) {
              operator_delete(plVar2,local_48[0] + 1);
            }
            if ((iVar5 == 0) &&
               (bVar4 = senjo::EngineOption::SetValue((EngineOption *)_optNMP,optionValue), bVar4))
            {
              local_58 = local_48;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_58,_optNMP._48_8_,_optNMP._56_8_ + _optNMP._48_8_);
              if (local_50 == DAT_001532b0) {
                if (local_50 == 0) {
                  bVar4 = true;
                }
                else {
                  iVar5 = bcmp(local_58,_TRUE_abi_cxx11_,local_50);
                  bVar4 = iVar5 == 0;
                }
              }
              else {
                bVar4 = false;
              }
              puVar9 = &_nmp;
            }
            else {
              pcVar1 = (psVar3->_M_dataplus)._M_p;
              local_58 = local_48;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_58,_optNMR._16_8_,_optNMR._24_8_ + _optNMR._16_8_);
              plVar2 = local_58;
              iVar5 = strcasecmp(pcVar1,(char *)local_58);
              if (plVar2 != local_48) {
                operator_delete(plVar2,local_48[0] + 1);
              }
              if ((iVar5 == 0) &&
                 (bVar4 = senjo::EngineOption::SetValue((EngineOption *)_optNMR,optionValue), bVar4)
                 ) {
                local_58 = local_48;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_58,_optNMR._48_8_,_optNMR._56_8_ + _optNMR._48_8_);
                if (local_50 == DAT_001532b0) {
                  if (local_50 == 0) {
                    bVar4 = true;
                  }
                  else {
                    iVar5 = bcmp(local_58,_TRUE_abi_cxx11_,local_50);
                    bVar4 = iVar5 == 0;
                  }
                }
                else {
                  bVar4 = false;
                }
                puVar9 = &_nmr;
              }
              else {
                pcVar1 = (psVar3->_M_dataplus)._M_p;
                local_58 = local_48;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_58,_optOneReply._16_8_,
                           _optOneReply._24_8_ + _optOneReply._16_8_);
                plVar2 = local_58;
                iVar5 = strcasecmp(pcVar1,(char *)local_58);
                if (plVar2 != local_48) {
                  operator_delete(plVar2,local_48[0] + 1);
                }
                if ((iVar5 != 0) ||
                   (bVar4 = senjo::EngineOption::SetValue((EngineOption *)_optOneReply,optionValue),
                   !bVar4)) {
                  pcVar1 = (psVar3->_M_dataplus)._M_p;
                  local_58 = local_48;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_58,_optRZR._16_8_,_optRZR._24_8_ + _optRZR._16_8_);
                  plVar2 = local_58;
                  iVar5 = strcasecmp(pcVar1,(char *)local_58);
                  if (plVar2 != local_48) {
                    operator_delete(plVar2,local_48[0] + 1);
                  }
                  if ((iVar5 == 0) &&
                     (bVar4 = senjo::EngineOption::SetValue((EngineOption *)_optRZR,optionValue),
                     bVar4)) {
                    iVar7 = senjo::EngineOption::GetIntValue((EngineOption *)_optRZR);
                    uVar6 = (undefined4)iVar7;
                    puVar8 = &_rzr;
                  }
                  else {
                    pcVar1 = (psVar3->_M_dataplus)._M_p;
                    local_58 = local_48;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_58,_optTempo._16_8_,
                               _optTempo._24_8_ + _optTempo._16_8_);
                    plVar2 = local_58;
                    iVar5 = strcasecmp(pcVar1,(char *)local_58);
                    if (plVar2 != local_48) {
                      operator_delete(plVar2,local_48[0] + 1);
                    }
                    if ((iVar5 == 0) &&
                       (bVar4 = senjo::EngineOption::SetValue((EngineOption *)_optTempo,optionValue)
                       , bVar4)) {
                      iVar7 = senjo::EngineOption::GetIntValue((EngineOption *)_optTempo);
                      uVar6 = (undefined4)iVar7;
                      puVar8 = &_tempo;
                    }
                    else {
                      pcVar1 = (psVar3->_M_dataplus)._M_p;
                      local_58 = local_48;
                      std::__cxx11::string::_M_construct<char*>
                                ((string *)&local_58,_optTest._16_8_,
                                 _optTest._24_8_ + _optTest._16_8_);
                      plVar2 = local_58;
                      iVar5 = strcasecmp(pcVar1,(char *)local_58);
                      if (plVar2 != local_48) {
                        operator_delete(plVar2,local_48[0] + 1);
                      }
                      if ((iVar5 != 0) ||
                         (bVar4 = senjo::EngineOption::SetValue
                                            ((EngineOption *)_optTest,optionValue), !bVar4)) {
                        return false;
                      }
                      iVar7 = senjo::EngineOption::GetIntValue((EngineOption *)_optTest);
                      uVar6 = (undefined4)iVar7;
                      puVar8 = (undefined4 *)&_test;
                    }
                  }
                  goto LAB_00106a42;
                }
                local_58 = local_48;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_58,_optOneReply._48_8_,
                           _optOneReply._56_8_ + _optOneReply._48_8_);
                if (local_50 == DAT_001532b0) {
                  if (local_50 == 0) {
                    bVar4 = true;
                  }
                  else {
                    iVar5 = bcmp(local_58,_TRUE_abi_cxx11_,local_50);
                    bVar4 = iVar5 == 0;
                  }
                }
                else {
                  bVar4 = false;
                }
                puVar9 = &_oneReply;
              }
            }
          }
        }
      }
      *puVar9 = bVar4;
      if (local_58 == local_48) {
        return true;
      }
      operator_delete(local_58,local_48[0] + 1);
      return true;
    }
    iVar7 = senjo::EngineOption::GetIntValue((EngineOption *)_optDelta);
    uVar6 = (undefined4)iVar7;
    puVar8 = &_delta;
  }
LAB_00106a42:
  *puVar8 = uVar6;
  return true;
}

Assistant:

bool Bitfoot::SetEngineOption(const std::string& optionName,
                             const std::string& optionValue)
{
  if (!stricmp(optionName.c_str(), _optHash.GetName().c_str())) {
    if (_optHash.SetValue(optionValue)) {
      SetHashSize(_optHash.GetIntValue());
      return true;
    }
  }
  if (!stricmp(optionName.c_str(), _optClearHash.GetName().c_str())) {
    ClearHash();
    return true;
  }
  if (!stricmp(optionName.c_str(), _optContempt.GetName().c_str())) {
    if (_optContempt.SetValue(optionValue)) {
      _contempt = static_cast<int>(_optContempt.GetIntValue());
      return true;
    }
  }
  if (!stricmp(optionName.c_str(), _optDelta.GetName().c_str())) {
    if (_optDelta.SetValue(optionValue)) {
      _delta = static_cast<int>(_optDelta.GetIntValue());
      return true;
    }
  }
  if (!stricmp(optionName.c_str(), _optEXT.GetName().c_str())) {
    if (_optEXT.SetValue(optionValue)) {
      _ext = (_optEXT.GetValue() == _TRUE);
      return true;
    }
  }
  if (!stricmp(optionName.c_str(), _optFutility.GetName().c_str())) {
    if (_optFutility.SetValue(optionValue)) {
      _futility = static_cast<int>(_optFutility.GetIntValue());
      return true;
    }
  }
  if (!stricmp(optionName.c_str(), _optIID.GetName().c_str())) {
    if (_optIID.SetValue(optionValue)) {
      _iid = (_optIID.GetValue() == _TRUE);
      return true;
    }
  }
  if (!stricmp(optionName.c_str(), _optLMR.GetName().c_str())) {
    if (_optLMR.SetValue(optionValue)) {
      _lmr = (_optLMR.GetValue() == _TRUE);
      return true;
    }
  }
  if (!stricmp(optionName .c_str(), _optNMP.GetName().c_str())) {
    if (_optNMP.SetValue(optionValue)) {
      _nmp = (_optNMP.GetValue() == _TRUE);
      return true;
    }
  }
  if (!stricmp(optionName.c_str(), _optNMR.GetName().c_str())) {
    if (_optNMR.SetValue(optionValue)) {
      _nmr = (_optNMR.GetValue() == _TRUE);
      return true;
    }
  }
  if (!stricmp(optionName .c_str(), _optOneReply.GetName().c_str())) {
    if (_optOneReply.SetValue(optionValue)) {
      _oneReply = (_optOneReply.GetValue() == _TRUE);
      return true;
    }
  }
  if (!stricmp(optionName.c_str(), _optRZR.GetName().c_str())) {
    if (_optRZR.SetValue(optionValue)) {
      _rzr = static_cast<int>(_optRZR.GetIntValue());
      return true;
    }
  }
  if (!stricmp(optionName.c_str(), _optTempo.GetName().c_str())) {
    if (_optTempo.SetValue(optionValue)) {
      _tempo = static_cast<int>(_optTempo.GetIntValue());
      return true;
    }
  }
  if (!stricmp(optionName.c_str(), _optTest.GetName().c_str())) {
    if (_optTest.SetValue(optionValue)) {
      _test = static_cast<int>(_optTest.GetIntValue());
      return true;
    }
  }
  return false;
}